

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

char * __thiscall IrSim::print3(IrSim *this,C_IC *i)

{
  size_t __maxlen;
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  string local_90;
  string local_70;
  string local_50;
  
  if ((i->arg2).kind != 0) {
    lVar2 = (long)i->kind;
    __maxlen = this->PBSIZE;
    pcVar3 = this->pb;
    if (lVar2 < 0x14) {
      pcVar1 = icFmt[lVar2];
      Operand::str_abi_cxx11_(&local_70,&i->target);
      Operand::str_abi_cxx11_(&local_90,&i->arg1);
      Operand::str_abi_cxx11_(&local_50,&i->arg2);
      snprintf(pcVar3,__maxlen,pcVar1,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p,
               local_50._M_dataplus._M_p);
    }
    else {
      pcVar1 = icFmt[lVar2];
      Operand::str_abi_cxx11_(&local_70,&i->arg1);
      Operand::str_abi_cxx11_(&local_90,&i->arg2);
      Operand::str_abi_cxx11_(&local_50,&i->target);
      snprintf(pcVar3,__maxlen,pcVar1,local_70._M_dataplus._M_p,local_90._M_dataplus._M_p,
               local_50._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    return this->pb;
  }
  pcVar3 = print2(this,i);
  return pcVar3;
}

Assistant:

const char *IrSim::print3(C_IC &i) const {
    if (i.arg2.kind == IR_NONE) return print2(i);
    if (i.kind < IC_RELOP)
        snprintf(pb, PBSIZE, icFmt[i.kind], i[0].str().c_str(), i[1].str().c_str(), i[2].str().c_str());
    else
        snprintf(pb, PBSIZE, icFmt[i.kind], i[1].str().c_str(), i[2].str().c_str(), i[0].str().c_str());
    return pb;
}